

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSC.cpp
# Opt level: O3

void __thiscall CSC::Triplet(CSC *this)

{
  ostream *poVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CSC:",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  iVar3 = this->col;
  if (0 < iVar3) {
    piVar2 = this->ptr;
    lVar5 = 0;
    do {
      lVar4 = (long)piVar2[lVar5];
      lVar6 = lVar5 + 1;
      if (piVar2[lVar5] < piVar2[lVar5 + 1]) {
        do {
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->idx[lVar4]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
          poVar1 = std::ostream::_M_insert<double>(this->val[lVar4]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
          lVar4 = lVar4 + 1;
          piVar2 = this->ptr;
        } while (lVar4 < piVar2[lVar6]);
        iVar3 = this->col;
      }
      lVar5 = lVar6;
    } while (lVar6 < iVar3);
  }
  return;
}

Assistant:

void CSC::Triplet()
{
    cout<<"CSC:"<<"\n";
   for(int i=0; i<col; i++)
   {
       for(int j=ptr[i]; j<ptr[i+1]; j++)
       {
           std::cout << idx[j] << "\t"; // row
           std::cout << i << "\t";     //column
           std::cout << val[j] << "\n"; //value
       }
   }
}